

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  string text;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"hello\nworld!\r\nfoo\rbar\n","");
  print_lines1(&local_30);
  print_lines2(&local_30);
  print_lines3(&local_30);
  print_lines4(&local_30);
  print_lines5(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
  const std::string text = "hello\nworld!\r\nfoo\rbar\n";

  print_lines1(text);
  print_lines2(text);
  print_lines3(text);
  print_lines4(text);
  print_lines5(text);
}